

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_int64 JX9StreamData_Read(void *pHandle,void *pBuffer,jx9_int64 nDatatoRead)

{
  ssize_t sVar1;
  jx9_int64 jVar2;
  jx9_stream_data *pData;
  
  jVar2 = -1;
  if ((pHandle != (void *)0x0) && (*(int *)((long)pHandle + 8) == 1)) {
    sVar1 = read(*(int *)((long)pHandle + 0x10),pBuffer,nDatatoRead);
    jVar2 = -1;
    if (0 < sVar1) {
      jVar2 = sVar1;
    }
  }
  return jVar2;
}

Assistant:

static jx9_int64 JX9StreamData_Read(void *pHandle, void *pBuffer, jx9_int64 nDatatoRead)
{
	jx9_stream_data *pData = (jx9_stream_data *)pHandle;
	if( pData == 0 ){
		return -1;
	}
	if( pData->iType != JX9_IO_STREAM_STDIN ){
		/* Forbidden */
		return -1;
	}
#ifdef __WINNT__
	{
		DWORD nRd;
		BOOL rc;
		rc = ReadFile(pData->x.pHandle, pBuffer, (DWORD)nDatatoRead, &nRd, 0);
		if( !rc ){
			/* IO error */
			return -1;
		}
		return (jx9_int64)nRd;
	}
#elif defined(__UNIXES__)
	{
		ssize_t nRd;
		int fd;
		fd = SX_PTR_TO_INT(pData->x.pHandle);
		nRd = read(fd, pBuffer, (size_t)nDatatoRead);
		if( nRd < 1 ){
			return -1;
		}
		return (jx9_int64)nRd;
	}
#else
	return -1;
#endif
}